

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQString * __thiscall SQStringTable::Add(SQStringTable *this,SQChar *news,SQInteger len)

{
  int iVar1;
  SQHash SVar2;
  SQString *pSVar3;
  ulong uVar4;
  SQString **ppSVar5;
  
  if (len < 0) {
    len = strlen(news);
  }
  SVar2 = _hashstr(news,len);
  uVar4 = this->_numofslots - 1 & SVar2;
  ppSVar5 = this->_strings + uVar4;
  while( true ) {
    pSVar3 = *ppSVar5;
    if (pSVar3 == (SQString *)0x0) {
      pSVar3 = (SQString *)sq_vm_malloc(len + 0x40);
      (pSVar3->super_SQRefCounted)._uiRef = 0;
      (pSVar3->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
      (pSVar3->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQRefCounted_001460e8;
      pSVar3->_sharedstate = this->_sharedstate;
      memcpy(pSVar3->_val,news,len);
      pSVar3->_val[len] = '\0';
      pSVar3->_len = len;
      pSVar3->_hash = SVar2;
      ppSVar5 = this->_strings;
      pSVar3->_next = ppSVar5[uVar4];
      ppSVar5[uVar4] = pSVar3;
      uVar4 = this->_slotused + 1;
      this->_slotused = uVar4;
      if (this->_numofslots < uVar4) {
        Resize(this,this->_numofslots * 2);
      }
      return pSVar3;
    }
    if ((pSVar3->_len == len) && (iVar1 = bcmp(news,pSVar3->_val,len), iVar1 == 0)) break;
    ppSVar5 = &pSVar3->_next;
  }
  return pSVar3;
}

Assistant:

SQString *SQStringTable::Add(const SQChar *news,SQInteger len)
{
    if(len<0)
        len = (SQInteger)scstrlen(news);
    SQHash newhash = ::_hashstr(news,len);
    SQHash h = newhash&(_numofslots-1);
    SQString *s;
    for (s = _strings[h]; s; s = s->_next){
        if(s->_len == len && (!memcmp(news,s->_val,sq_rsl(len))))
            return s; //found
    }

    SQString *t = (SQString *)SQ_MALLOC(sq_rsl(len)+sizeof(SQString));
    new (t) SQString;
    t->_sharedstate = _sharedstate;
    memcpy(t->_val,news,sq_rsl(len));
    t->_val[len] = _SC('\0');
    t->_len = len;
    t->_hash = newhash;
    t->_next = _strings[h];
    _strings[h] = t;
    _slotused++;
    if (_slotused > _numofslots)  /* too crowded? */
        Resize(_numofslots*2);
    return t;
}